

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O2

handle pybind11::detail::
       set_caster<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>,long>
       ::cast<std::unordered_set<long,std::hash<long>,std::equal_to<long>,std::allocator<long>>>
                 (unordered_set<long,_std::hash<long>,_std::equal_to<long>,_std::allocator<long>_>
                  *src,return_value_policy policy,handle parent)

{
  bool bVar1;
  __node_base *p_Var2;
  handle hVar3;
  set s;
  object value_;
  handle local_28;
  handle local_20;
  
  set::set((set *)&local_28);
  p_Var2 = &(src->_M_h)._M_before_begin;
  do {
    hVar3.m_ptr = local_28.m_ptr;
    p_Var2 = p_Var2->_M_nxt;
    if (p_Var2 == (__node_base *)0x0) {
      local_28.m_ptr = (PyObject *)0x0;
LAB_001dd181:
      object::~object((object *)&local_28);
      return (handle)hVar3.m_ptr;
    }
    local_20.m_ptr = (PyObject *)PyLong_FromSsize_t(p_Var2[1]._M_nxt);
    if (local_20.m_ptr == (PyObject *)0x0) {
LAB_001dd16a:
      object::~object((object *)&local_20);
      hVar3.m_ptr = (PyObject *)0x0;
      goto LAB_001dd181;
    }
    bVar1 = set::add<pybind11::object&>((set *)&local_28,(object *)&local_20);
    if (!bVar1) goto LAB_001dd16a;
    object::~object((object *)&local_20);
  } while( true );
}

Assistant:

static handle cast(T &&src, return_value_policy policy, handle parent) {
        if (!std::is_lvalue_reference<T>::value)
            policy = return_value_policy_override<Key>::policy(policy);
        pybind11::set s;
        for (auto &&value : src) {
            auto value_ = reinterpret_steal<object>(key_conv::cast(forward_like<T>(value), policy, parent));
            if (!value_ || !s.add(value_))
                return handle();
        }
        return s.release();
    }